

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  ostream *this;
  void *this_00;
  TPZFMatrix<double> *in_RCX;
  int in_EDX;
  TPZVec<double> *in_RSI;
  int in_EDI;
  TPZFMatrix<double> *in_R8;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZFMatrix<double> *in_stack_00000578;
  TPZFMatrix<double> *in_stack_00000580;
  int in_stack_0000058c;
  TPZVec<double> *in_stack_00000590;
  TPZFMatrix<double> *in_stack_00000858;
  TPZFMatrix<double> *in_stack_00000860;
  int in_stack_0000086c;
  TPZVec<double> *in_stack_00000870;
  TPZFMatrix<double> *in_stack_00000cc8;
  TPZFMatrix<double> *in_stack_00000cd0;
  int in_stack_00000cdc;
  TPZVec<double> *in_stack_00000ce0;
  
  if ((in_EDI < 6) || (0x14 < in_EDI)) {
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  switch(in_EDI) {
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    TPZShapeLinear::ShapeInternal(in_RSI,in_EDX,in_RCX,in_R8);
    break;
  case 0xf:
  case 0x13:
    TPZShapeTriang::ShapeInternal
              (in_stack_00000ce0,in_stack_00000cdc,in_stack_00000cd0,in_stack_00000cc8);
    break;
  case 0x10:
  case 0x11:
  case 0x12:
    TPZShapeQuad::ShapeInternal
              (in_stack_00000590,in_stack_0000058c,in_stack_00000580,in_stack_00000578);
    break;
  case 0x14:
    ShapeInternal(in_stack_00000870,in_stack_0000086c,in_stack_00000860,in_stack_00000858);
    break;
  default:
    this = std::operator<<((ostream *)&std::cout,"Wrong side parameter side ");
    this_00 = (void *)std::ostream::operator<<(this,in_EDI);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  return;
}

Assistant:

void TPZShapePrism::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                      TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi){
        if (side < 6 || side > 20) {
            DebugStop();
        }
        
        switch (side) {
                
            case 6:
            case 7:
            case 8:
            case 9:
            case 10:
            case 11:
            case 12:
            case 13:
            case 14:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            case 15:
            case 19:
                
            {
            
                pzshape::TPZShapeTriang::ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            case 16:
            case 17:
            case 18:
            {
                pzshape::TPZShapeQuad::ShapeInternal(x, order, phi, dphi);
            }
                break;

            case 20:
            {
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
                std::cout << "Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }
     
        
    }